

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

int ffvcks(fitsfile *fptr,int *datastatus,int *hdustatus,int *status)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  char local_f8 [8];
  char comm [73];
  char chksum [71];
  unsigned_long olddatasum;
  unsigned_long hdusum;
  unsigned_long datasum;
  double tdouble;
  int *piStack_30;
  int tstatus;
  int *status_local;
  int *hdustatus_local;
  int *datastatus_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    *datastatus = -1;
    *hdustatus = -1;
    tdouble._4_4_ = *status;
    piStack_30 = status;
    status_local = hdustatus;
    hdustatus_local = datastatus;
    datastatus_local = &fptr->HDUposition;
    iVar1 = ffgkys(fptr,"CHECKSUM",comm + 0x48,local_f8,status);
    if (iVar1 == 0xca) {
      *status_local = 0;
      *piStack_30 = tdouble._4_4_;
    }
    if (comm[0x48] == '\0') {
      *status_local = 0;
    }
    iVar1 = ffgkys((fitsfile *)datastatus_local,"DATASUM",comm + 0x48,local_f8,piStack_30);
    if (iVar1 == 0xca) {
      *hdustatus_local = 0;
      *piStack_30 = tdouble._4_4_;
    }
    if (comm[0x48] == '\0') {
      *hdustatus_local = 0;
    }
    if ((*piStack_30 < 1) && ((*status_local != 0 || (*hdustatus_local != 0)))) {
      datasum = (unsigned_long)atof(comm + 0x48);
      dVar3 = (double)datasum - 9.223372036854776e+18;
      uVar2 = (ulong)(double)datasum;
      iVar1 = ffgcks((fitsfile *)datastatus_local,&hdusum,&olddatasum,piStack_30);
      if (iVar1 < 1) {
        if ((*hdustatus_local != 0) && (hdusum == (uVar2 | (long)dVar3 & (long)uVar2 >> 0x3f))) {
          *hdustatus_local = 1;
        }
        if ((*status_local != 0) && ((olddatasum == 0 || (olddatasum == 0xffffffff)))) {
          *status_local = 1;
        }
        fptr_local._4_4_ = *piStack_30;
      }
      else {
        fptr_local._4_4_ = *piStack_30;
      }
    }
    else {
      fptr_local._4_4_ = *piStack_30;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffvcks(fitsfile *fptr,      /* I - FITS file pointer                  */
           int *datastatus,     /* O - data checksum status               */
           int *hdustatus,      /* O - hdu checksum status                */
                                /*     1  verification is correct         */
                                /*     0  checksum keyword is not present */
                                /*    -1 verification not correct         */
           int *status)         /* IO - error status                      */
/*
    Verify the HDU by comparing the value of the computed checksums against
    the values of the DATASUM and CHECKSUM keywords if they are present.
*/
{
    int tstatus;
    double tdouble;
    unsigned long datasum, hdusum, olddatasum;
    char chksum[FLEN_VALUE], comm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *datastatus = -1;
    *hdustatus  = -1;

    tstatus = *status;
    if (ffgkys(fptr, "CHECKSUM", chksum, comm, status) == KEY_NO_EXIST)
    {
        *hdustatus = 0;             /* CHECKSUM keyword does not exist */
        *status = tstatus;
    }
    if (chksum[0] == '\0')
        *hdustatus = 0;    /* all blank checksum means it is undefined */

    if (ffgkys(fptr, "DATASUM", chksum, comm, status) == KEY_NO_EXIST)
    {
        *datastatus = 0;            /* DATASUM keyword does not exist */
        *status = tstatus;
    }
    if (chksum[0] == '\0')
        *datastatus = 0;    /* all blank checksum means it is undefined */

    if ( *status > 0 || (!(*hdustatus) && !(*datastatus)) )
        return(*status);            /* return if neither keywords exist */

    /* convert string to unsigned long */

    /* olddatasum = strtoul(chksum, 0, 10);  doesn't work w/ gcc on SUN OS */
    /* sscanf(chksum, "%u", &olddatasum);   doesn't work w/ cc on VAX/VMS */

    tdouble = atof(chksum); /* read as a double as a workaround */
    olddatasum = (unsigned long) tdouble;

    /*  calculate the data checksum and the HDU checksum */
    if (ffgcks(fptr, &datasum, &hdusum, status) > 0)
        return(*status);

    if (*datastatus)
        if (datasum == olddatasum)
            *datastatus = 1;

    if (*hdustatus)
        if (hdusum == 0 || hdusum == 0xFFFFFFFF)
            *hdustatus = 1;

    return(*status);
}